

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O3

void __thiscall tlog::Progress::Progress(Progress *this,Logger *logger,uint64_t total)

{
  Logger *this_00;
  rep rVar1;
  long lVar2;
  
  this->mLogger = logger;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->mStartTime).__d.__r = rVar1;
  this->mTotal = total;
  this->mCurrent = 0;
  this_00 = this->mLogger;
  lVar2 = std::chrono::_V2::steady_clock::now();
  Logger::progress<std::chrono::duration<long,std::ratio<1l,1000000l>>>
            (this_00,0,total,
             (duration<long,_std::ratio<1L,_1000000L>_>)
             ((lVar2 - (this->mStartTime).__d.__r) / 1000));
  return;
}

Assistant:

Progress(Logger* logger, uint64_t total)
        : mLogger{logger}, mStartTime{std::chrono::steady_clock::now()}, mTotal{total} {
            update(0); // Initial print with 0 progress.
        }